

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_fe241b::SatdLpTest::SatdLpTest(SatdLpTest *this)

{
  SatdTestParam<int_(*)(const_short_*,_int)> *in_RDI;
  SatdTestBase<short,_int_(*)(const_short_*,_int)> *unaff_retaddr;
  SatdTestParam<int_(*)(const_short_*,_int)> *func_param;
  
  func_param = in_RDI;
  testing::WithParamInterface<(anonymous_namespace)::SatdTestParam<int_(*)(const_short_*,_int)>_>::
  GetParam();
  SatdTestBase<short,_int_(*)(const_short_*,_int)>::SatdTestBase(unaff_retaddr,func_param);
  *(undefined ***)in_RDI = &PTR__SatdLpTest_01f97ce8;
  in_RDI->func_simd = (_func_int_short_ptr_int *)&PTR__SatdLpTest_01f97d28;
  return;
}

Assistant:

SatdLpTest() : SatdTestBase(GetParam()) {}